

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devices.cpp
# Opt level: O1

void __thiscall CDevice::AddPage(CDevice *this,byte *memory,int32_t size)

{
  int iVar1;
  CDevicePage *pCVar2;
  
  if (this->PagesCount == 0x400) {
    ErrorInt("Can\'t add more pages, already at max",0x400,FATAL);
  }
  pCVar2 = (CDevicePage *)operator_new(0x10);
  iVar1 = this->PagesCount;
  pCVar2->Size = size;
  pCVar2->Number = iVar1;
  pCVar2->RAM = memory;
  if (memory == (byte *)0x0) {
    Error("No memory defined",(char *)0x0,FATAL);
  }
  iVar1 = this->PagesCount;
  this->Pages[iVar1] = pCVar2;
  this->PagesCount = iVar1 + 1;
  return;
}

Assistant:

void CDevice::AddPage(byte* memory, int32_t size) {
	if (CDeviceDef::MAX_PAGE_N == PagesCount) ErrorInt("Can't add more pages, already at max", CDeviceDef::MAX_PAGE_N, FATAL);
	Pages[PagesCount] = new CDevicePage(memory, size, PagesCount);
	PagesCount++;
}